

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFPageDocumentHelper::removePage(QPDFPageDocumentHelper *this,QPDFPageObjectHelper *page)

{
  QPDF *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  QPDFPageObjectHelper *page_local;
  QPDFPageDocumentHelper *this_local;
  
  this_00 = (this->super_QPDFDocumentHelper).qpdf;
  local_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)page;
  page_local = (QPDFPageObjectHelper *)this;
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)&stack0xffffffffffffffd8);
  QPDF::removePage(this_00,(QPDFObjectHandle *)&stack0xffffffffffffffd8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void
QPDFPageDocumentHelper::removePage(QPDFPageObjectHelper page)
{
    this->qpdf.removePage(page.getObjectHandle());
}